

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

optional<unsigned_int> __thiscall
slang::ast::BinaryExpression::getEffectiveWidthImpl(BinaryExpression *this)

{
  _Optional_payload_base<unsigned_int> *p_Var1;
  _Optional_payload_base<unsigned_int> _Var2;
  ulong uVar3;
  _Optional_payload_base<unsigned_int> _Var4;
  _Optional_base<unsigned_int,_true,_true> local_20;
  _Optional_payload_base<unsigned_int> local_18;
  
  _Var2._M_payload = (_Storage<unsigned_int,_true>)0x0;
  _Var2._M_engaged = true;
  _Var2._5_3_ = 0;
  _Var4._M_payload = (_Storage<unsigned_int,_true>)0x1;
  _Var4._M_engaged = false;
  _Var4._5_3_ = 0;
  uVar3 = 0;
  if ((0x7ffe00U >> (this->op & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
    if ((0x1ffU >> (this->op & (LogicalShiftRight|BinaryXor)) & 1) == 0) {
      _Var2 = (_Optional_payload_base<unsigned_int>)Expression::getEffectiveWidth(this->left_);
    }
    else {
      local_18 = (_Optional_payload_base<unsigned_int>)Expression::getEffectiveWidth(this->left_);
      local_20._M_payload.super__Optional_payload_base<unsigned_int> =
           (_Optional_payload<unsigned_int,_true,_true,_true>)
           Expression::getEffectiveWidth(this->right_);
      p_Var1 = (_Optional_payload_base<unsigned_int> *)
               std::max<std::optional<unsigned_int>>
                         ((optional<unsigned_int> *)&local_18,(optional<unsigned_int> *)&local_20);
      _Var2 = *p_Var1;
    }
    uVar3 = (ulong)_Var2 & 0xffffff0000000000;
    _Var4 = _Var2;
  }
  return (optional<unsigned_int>)((ulong)_Var4 & 0xffffffff | (ulong)_Var2 & 0xff00000000 | uVar3);
}

Assistant:

std::optional<bitwidth_t> BinaryExpression::getEffectiveWidthImpl() const {
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
        case BinaryOperator::Divide:
        case BinaryOperator::Mod:
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            return std::max(left().getEffectiveWidth(), right().getEffectiveWidth());
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            return 1;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
        case BinaryOperator::Power:
            return left().getEffectiveWidth();
    }
    SLANG_UNREACHABLE;
}